

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteBuiltin_db_drop_record(jx9_context *pCtx,int argc,jx9_value **argv)

{
  jx9_user_func *pjVar1;
  int iVar2;
  unqlite_col *pCol;
  char *pcVar3;
  int iFlag;
  jx9_value *pjVar4;
  jx9_vm *pVm;
  anon_union_8_3_18420de5_for_x aVar5;
  int nByte;
  SyString sName;
  uint local_2c;
  SyString local_28;
  
  if (argc < 2) {
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar3 = "Missing collection name and/or records";
LAB_00118f8b:
    jx9VmThrowError(pVm,&pjVar1->sName,1,pcVar3);
  }
  else {
    pcVar3 = jx9_value_to_string(*argv,(int *)&local_2c);
    if ((int)local_2c < 1) {
      pjVar1 = pCtx->pFunc;
      pVm = pCtx->pVm;
      pcVar3 = "Invalid collection name";
      goto LAB_00118f8b;
    }
    local_28.nByte = local_2c;
    local_28.zString = pcVar3;
    pCol = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&local_28,iFlag);
    if (pCol != (unqlite_col *)0x0) {
      pjVar4 = argv[1];
      jx9MemObjToInteger(pjVar4);
      iVar2 = unqliteCollectionDropRecord(pCol,(pjVar4->x).iVal,1,1);
      aVar5.iVal._1_7_ = 0;
      aVar5.iVal._0_1_ = iVar2 == 0;
      pjVar4 = pCtx->pRet;
      jx9MemObjRelease(pjVar4);
      pjVar4->x = aVar5;
      goto LAB_00118fa8;
    }
    jx9_context_throw_error_format(pCtx,1,"No such collection \'%z\'",&local_28);
  }
  pjVar4 = pCtx->pRet;
  jx9MemObjRelease(pjVar4);
  (pjVar4->x).rVal = 0.0;
LAB_00118fa8:
  pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int unqliteBuiltin_db_drop_record(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	jx9_int64 nId;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 2 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or records");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol == 0 ){
		jx9_context_throw_error_format(pCtx,JX9_CTX_ERR,"No such collection '%z'",&sName);
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	/* Extract the record ID */
	nId = jx9_value_to_int64(argv[1]);
	/* Drop the record */
	rc = unqliteCollectionDropRecord(pCol,nId,1,1);
	/* Processing result */
	jx9_result_bool(pCtx,rc == UNQLITE_OK);
	return JX9_OK;
}